

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  Vector<float,_4> *in_RCX;
  ulong uVar2;
  Type in0;
  float afStack_88 [2];
  undefined8 local_80;
  float local_78;
  ulong local_70;
  Vector<float,_2> local_68 [3];
  int aiStack_50 [6];
  Matrix<float,_2,_4> local_38;
  
  uVar2 = CONCAT44((int)((uint)(in0Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f,
                   (int)((uint)(in0Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f);
  local_70 = ~uVar2 & (ulong)DAT_01bf4140 | *(ulong *)(evalCtx->coords).m_data & uVar2;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_68[0].m_data = *(float (*) [2])(evalCtx->coords).m_data;
    local_68[1].m_data = *(float (*) [2])((evalCtx->coords).m_data + 2);
  }
  else {
    local_68[0].m_data[0] = 0.2;
    local_68[0].m_data[1] = -1.0;
    local_68[1].m_data = (float  [2])0x3f4ccccd3f000000;
  }
  outerProduct<float,4,2>(&local_38,(MatrixCaseUtils *)&local_70,local_68,in_RCX);
  local_80 = CONCAT44(local_38.m_data.m_data[3].m_data[1] +
                      local_38.m_data.m_data[1].m_data[1] + local_38.m_data.m_data[1].m_data[0],
                      local_38.m_data.m_data[3].m_data[0] +
                      local_38.m_data.m_data[0].m_data[0] + local_38.m_data.m_data[0].m_data[1]);
  local_78 = local_38.m_data.m_data[2].m_data[0] + local_38.m_data.m_data[2].m_data[1];
  aiStack_50[2] = 0;
  aiStack_50[3] = 1;
  aiStack_50[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_50[lVar1]] = afStack_88[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}